

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeFilterOne(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int Entry;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Gia_Obj_t *pGVar7;
  int iVar8;
  int i;
  
  p_00 = Vec_BitStart(p->nObjs);
  p_01 = Vec_BitStart(p->nObjs);
  iVar8 = 1;
  while( true ) {
    iVar1 = vTree->nSize;
    if (iVar1 <= iVar8) break;
    iVar1 = Vec_IntEntry(vTree,iVar8 + -1);
    Vec_IntEntry(vTree,iVar8);
    iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
    Vec_BitWriteEntry(p_00,iVar2,1);
    iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
    Vec_BitWriteEntry(p_00,iVar1,1);
    iVar8 = iVar8 + 2;
  }
  for (iVar8 = 1; iVar8 < iVar1; iVar8 = iVar8 + 2) {
    iVar1 = Vec_IntEntry(vTree,iVar8 + -1);
    Vec_IntEntry(vTree,iVar8);
    iVar1 = iVar1 * 6;
    iVar2 = Vec_IntEntry(vAdds,iVar1);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar2 = Vec_IntEntry(vAdds,iVar1 + 1);
    Vec_BitWriteEntry(p_00,iVar2,0);
    iVar1 = Vec_IntEntry(vAdds,iVar1 + 2);
    Vec_BitWriteEntry(p_00,iVar1,0);
    iVar1 = vTree->nSize;
  }
  iVar8 = 1;
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar7 = Gia_ManObj(p,iVar1);
    if (pGVar7 == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(undefined8 *)pGVar7;
    if ((~uVar3 & 0x1fffffff) != 0 && -1 < (int)uVar3) {
      iVar2 = Vec_BitEntry(p_00,iVar1 - (uVar3 & 0x1fffffff));
      if (iVar2 == 0) {
        iVar2 = Vec_BitEntry(p_00,iVar1 - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
        if (iVar2 == 0) {
          iVar2 = Vec_BitEntry(p_01,iVar1 - (*(uint *)pGVar7 & 0x1fffffff));
          if (iVar2 == 0) {
            iVar2 = Vec_BitEntry(p_01,iVar1 - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
            if (iVar2 == 0) goto LAB_00545c29;
          }
        }
      }
      Vec_BitWriteEntry(p_01,iVar1,1);
    }
LAB_00545c29:
  }
  iVar1 = 0;
  do {
    if (vTree->nSize <= iVar8) {
      Vec_IntShrink(vTree,iVar1);
      Vec_BitFree(p_00);
      Vec_BitFree(p_01);
      return;
    }
    uVar3 = Vec_IntEntry(vTree,iVar8 + -1);
    Entry = Vec_IntEntry(vTree,iVar8);
    iVar2 = uVar3 * 6 + 3;
    iVar4 = Vec_IntEntry(vAdds,iVar2);
    iVar4 = Vec_BitEntry(p_01,iVar4);
    i = uVar3 * 6 + 4;
    if (iVar4 == 0) {
      iVar4 = Vec_IntEntry(vAdds,i);
      iVar4 = Vec_BitEntry(p_01,iVar4);
      if (iVar4 != 0) goto LAB_00545ca9;
      iVar2 = iVar1 + 1;
      Vec_IntWriteEntry(vTree,iVar1,uVar3);
      iVar1 = iVar1 + 2;
      Vec_IntWriteEntry(vTree,iVar2,Entry);
    }
    else {
LAB_00545ca9:
      uVar5 = Vec_IntEntry(vAdds,iVar2);
      uVar6 = Vec_IntEntry(vAdds,i);
      printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)uVar3,(ulong)uVar5,(ulong)uVar6,Entry);
    }
    iVar8 = iVar8 + 2;
  } while( true );
}

Assistant:

void Acec_TreeFilterOne( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+0), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+1), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+2), 0 );
    }
    // iterate through nodes to detect TFO of roots
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_BitEntry(vIsRoot, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vIsRoot, Gia_ObjFaninId1(pObj,i)) ||
             Vec_BitEntry(vMarked, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vMarked, Gia_ObjFaninId1(pObj,i)) )
            Vec_BitWriteEntry( vMarked, i, 1 );
    }
    // remove those that overlap with roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        // special case of the first bit
//        if ( i == 0 )
//            continue;

/*
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 24 && Vec_IntEntry(vAdds, 6*Box+4) == 22 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 48 && Vec_IntEntry(vAdds, 6*Box+4) == 49 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
*/
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsRoot );
    Vec_BitFree( vMarked );
}